

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

uint64_t ShannonEntropy_C(uint32_t *X,int n)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (n < 1) {
    uVar3 = 0;
    lVar5 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    lVar5 = 0;
    do {
      uVar1 = X[uVar4];
      if ((ulong)uVar1 != 0) {
        if (uVar1 < 0x100) {
          uVar2 = kSLog2Table[uVar1];
        }
        else {
          uVar2 = (*VP8LFastSLog2Slow)(uVar1);
        }
        uVar3 = uVar3 + uVar1;
        lVar5 = lVar5 + uVar2;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    if (0xff < uVar3) {
      uVar2 = (*VP8LFastSLog2Slow)(uVar3);
      goto LAB_00143cdd;
    }
  }
  uVar2 = kSLog2Table[uVar3];
LAB_00143cdd:
  return uVar2 - lVar5;
}

Assistant:

static uint64_t ShannonEntropy_C(const uint32_t* X, int n) {
  int i;
  uint64_t retval = 0;
  uint32_t sumX = 0;
  for (i = 0; i < n; ++i) {
    const int x = X[i];
    if (x != 0) {
      sumX += x;
      retval += VP8LFastSLog2(x);
    }
  }
  retval = VP8LFastSLog2(sumX) - retval;
  return retval;
}